

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemWatcher_inotify.cpp
# Opt level: O0

int __thiscall FileSystemWatcher::init(FileSystemWatcher *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  element_type *this_00;
  FileSystemWatcher *local_70;
  code *local_68;
  undefined8 local_60;
  type local_58;
  function<void_(int,_unsigned_int)> local_40;
  shared_ptr<EventLoop> local_20;
  FileSystemWatcher *local_10;
  FileSystemWatcher *this_local;
  
  local_10 = this;
  iVar1 = inotify_init1(0x80000);
  this->mFd = iVar1;
  if (this->mFd != -1) {
    EventLoop::eventLoop();
    this_00 = std::__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                         )&local_20);
    iVar1 = this->mFd;
    local_68 = notifyReadyRead;
    local_60 = 0;
    local_70 = this;
    std::bind<void(FileSystemWatcher::*)(),FileSystemWatcher*>
              (&local_58,(offset_in_FileSystemWatcher_to_subr *)&local_68,&local_70);
    std::function<void(int,unsigned_int)>::
    function<std::_Bind<void(FileSystemWatcher::*(FileSystemWatcher*))()>,void>
              ((function<void(int,unsigned_int)> *)&local_40,&local_58);
    EventLoop::registerSocket(this_00,iVar1,1,&local_40);
    std::function<void_(int,_unsigned_int)>::~function(&local_40);
    std::shared_ptr<EventLoop>::~shared_ptr(&local_20);
    return extraout_EAX;
  }
  __assert_fail("mFd != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/FileSystemWatcher_inotify.cpp"
                ,0x11,"void FileSystemWatcher::init()");
}

Assistant:

void FileSystemWatcher::init()
{
    mFd = inotify_init1(IN_CLOEXEC);
    assert(mFd != -1);
    EventLoop::eventLoop()->registerSocket(mFd, EventLoop::SocketRead, std::bind(&FileSystemWatcher::notifyReadyRead, this));
}